

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O3

GCtab * newtab(lua_State *L,uint32_t asize,uint32_t hbits)

{
  long *plVar1;
  GCtab *pGVar2;
  void *pvVar3;
  int iVar4;
  
  if (asize - 1 < 0x10) {
    pGVar2 = (GCtab *)lj_mem_newgco(L,asize * 8 + 0x20);
    pGVar2->gct = '\v';
    pGVar2->nomm = 0xff;
    pGVar2->colo = (int8_t)asize;
    (pGVar2->array).ptr32 = (int)pGVar2 + 0x20;
    (pGVar2->metatable).gcptr32 = 0;
    pGVar2->asize = asize;
    pGVar2->hmask = 0;
    (pGVar2->node).ptr32 = (L->glref).ptr32 + 0x130;
  }
  else {
    pGVar2 = (GCtab *)lj_mem_newgco(L,0x20);
    pGVar2->gct = '\v';
    pGVar2->nomm = 0xff;
    pGVar2->colo = '\0';
    (pGVar2->array).ptr32 = 0;
    (pGVar2->metatable).gcptr32 = 0;
    pGVar2->asize = 0;
    pGVar2->hmask = 0;
    (pGVar2->node).ptr32 = (L->glref).ptr32 + 0x130;
    if (asize != 0) {
      if (0x8000001 < asize) goto LAB_00116c1c;
      pvVar3 = lj_mem_realloc(L,(void *)0x0,0,asize * 8);
      (pGVar2->array).ptr32 = (uint32_t)pvVar3;
      pGVar2->asize = asize;
    }
  }
  if (hbits != 0) {
    if (0x1a < hbits) {
LAB_00116c1c:
      lj_err_msg(L,LJ_ERR_TABOV);
    }
    iVar4 = 1 << ((byte)hbits & 0x1f);
    pvVar3 = lj_mem_realloc(L,(void *)0x0,0,(GCSize)(0x18L << ((byte)hbits & 0x3f)));
    (pGVar2->node).ptr32 = (uint32_t)pvVar3;
    *(uint32_t *)((long)pvVar3 + 0x14) = (uint32_t)pvVar3 + iVar4 * 0x18;
    pGVar2->hmask = iVar4 - 1;
  }
  plVar1 = (long *)((ulong)(L->glref).ptr32 + 0xd0);
  *plVar1 = *plVar1 + 1;
  return pGVar2;
}

Assistant:

static GCtab *newtab(lua_State *L, uint32_t asize, uint32_t hbits)
{
  GCtab *t;
  /* First try to colocate the array part. */
  if (LJ_MAX_COLOSIZE != 0 && asize > 0 && asize <= LJ_MAX_COLOSIZE) {
    Node *nilnode;
    lj_assertL((sizeof(GCtab) & 7) == 0, "bad GCtab size");
    t = (GCtab *)lj_mem_newgco(L, sizetabcolo(asize));
    t->gct = ~LJ_TTAB;
    t->nomm = (uint8_t)~0;
    t->colo = (int8_t)asize;
    setmref(t->array, (TValue *)((char *)t + sizeof(GCtab)));
    setgcrefnull(t->metatable);
    t->asize = asize;
    t->hmask = 0;
    nilnode = &G(L)->nilnode;
    setmref(t->node, nilnode);
#if LJ_GC64
    setmref(t->freetop, nilnode);
#endif
  } else {  /* Otherwise separately allocate the array part. */
    Node *nilnode;
    t = lj_mem_newobj(L, GCtab);
    t->gct = ~LJ_TTAB;
    t->nomm = (uint8_t)~0;
    t->colo = 0;
    setmref(t->array, NULL);
    setgcrefnull(t->metatable);
    t->asize = 0;  /* In case the array allocation fails. */
    t->hmask = 0;
    nilnode = &G(L)->nilnode;
    setmref(t->node, nilnode);
#if LJ_GC64
    setmref(t->freetop, nilnode);
#endif
    if (asize > 0) {
      if (asize > LJ_MAX_ASIZE)
	lj_err_msg(L, LJ_ERR_TABOV);
      setmref(t->array, lj_mem_newvec(L, asize, TValue));
      t->asize = asize;
    }
  }
  if (hbits)
    newhpart(L, t, hbits);
  G(L)->gc.tabnum++;
  return t;
}